

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

int get_password_response(uint32_t nonce,char *password,uint8_t *response)

{
  uint8_t uVar1;
  size_t sVar2;
  uint8_t *data;
  uint8_t uVar3;
  uint8_t *result;
  uint len;
  uint8_t *puVar4;
  
  sVar2 = strlen(password);
  len = (int)sVar2 + 8;
  data = (uint8_t *)malloc((ulong)len);
  uVar1 = *password;
  result = data;
  if (uVar1 != '\0') {
    puVar4 = (uint8_t *)(password + 1);
    do {
      uVar3 = uVar1 + 0xe0;
      if (0x19 < (byte)(uVar1 + 0x9f)) {
        uVar3 = uVar1;
      }
      *result = uVar3;
      result = result + 1;
      uVar1 = *puVar4;
      puVar4 = puVar4 + 1;
    } while (uVar1 != '\0');
  }
  digest_to_hex32(nonce,(char *)result);
  digest_get(data,len,response);
  free(data);
  return 0;
}

Assistant:

int get_password_response(uint32_t nonce, const char *password,
			  uint8_t response[PROXY_PASS_RES_LEN])
{
	unsigned int pass_with_nonce_len = (unsigned int)strlen(password) + 8;
	uint8_t *pass_with_nonce = malloc(pass_with_nonce_len);
	char *iter = (char *)pass_with_nonce;

	while (*password != '\0') {
		if (*password >= 97 && *password <= 122)
			*iter = *password - 32;
		else
			*iter = *password;

		iter++;
		password++;
	}

	digest_to_hex32(nonce, iter);

	digest_get(pass_with_nonce, pass_with_nonce_len, response);

	free(pass_with_nonce);

	return 0;
}